

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzv3dmesh.cpp
# Opt level: O0

void __thiscall
TPZV3DGraphMesh::TPZV3DGraphMesh
          (TPZV3DGraphMesh *this,TPZCompMesh *cmesh,int dimension,
          set<int,_std::less<int>,_std::allocator<int>_> *matids,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *scalarnames,
          TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *vecnames)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int i;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000048;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_00000050;
  int in_stack_0000005c;
  TPZCompMesh *in_stack_00000060;
  void **in_stack_00000068;
  TPZGraphMesh *in_stack_00000070;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000080;
  int local_34;
  
  TPZGraphMesh::TPZGraphMesh
            (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_0000005c,
             in_stack_00000050,in_stack_00000048,in_stack_00000080);
  *in_RDI = &PTR__TPZV3DGraphMesh_0252fcd8;
  in_RDI[0xa1] = in_RSI;
  *(undefined4 *)((long)in_RDI + 0x284) = 2;
  *(undefined4 *)(in_RDI + 0xa2) = 0;
  *(undefined4 *)((long)in_RDI + 0x51c) = 0;
  *(undefined4 *)((long)in_RDI + 0x514) = 0;
  *(undefined4 *)(in_RDI + 0xa3) = 0;
  for (local_34 = 0; local_34 < 6; local_34 = local_34 + 1) {
    *(undefined4 *)((long)in_RDI + (long)local_34 * 4 + 0x520) = 0;
  }
  return;
}

Assistant:

TPZV3DGraphMesh::TPZV3DGraphMesh(TPZCompMesh *cmesh, int dimension, const std::set<int> & matids, const TPZVec<std::string> &scalarnames,
                                 const TPZVec<std::string> &vecnames) : TPZGraphMesh(cmesh,dimension,matids,scalarnames,vecnames) {
	fMesh = cmesh;
	fStyle = EV3DStyle;
	fNumCases = 0;
	fTotScal = 0;
	fInterval = 0;
	fLoadStep = 0;
	for(int i=0; i<6; i++) fNumScal[i] = 0;
}